

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTranslate.cpp
# Opt level: O0

void TranslateZeroInitialize(ExpressionTranslateContext *ctx,ExprZeroInitialize *expression)

{
  TypeBase *node;
  bool bVar1;
  TypeRef *pTVar2;
  TypeBase *type;
  TypeRef *refType;
  ExprZeroInitialize *expression_local;
  ExpressionTranslateContext *ctx_local;
  
  pTVar2 = getType<TypeRef>(expression->address->type);
  if (pTVar2 == (TypeRef *)0x0) {
    __assert_fail("refType",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTranslate.cpp"
                  ,0x4b3,
                  "void TranslateZeroInitialize(ExpressionTranslateContext &, ExprZeroInitialize *)"
                 );
  }
  node = pTVar2->subType;
  bVar1 = isType<TypeVoid>(node);
  if (bVar1) {
    Print(ctx,"0");
  }
  else {
    bVar1 = isType<TypeBool>(node);
    if (bVar1) {
      Print(ctx,"*(");
      Translate(ctx,expression->address);
      Print(ctx,") = false");
    }
    else {
      bVar1 = isType<TypeChar>(node);
      if ((((bVar1) || (bVar1 = isType<TypeShort>(node), bVar1)) ||
          (bVar1 = isType<TypeInt>(node), bVar1)) ||
         (((bVar1 = isType<TypeLong>(node), bVar1 || (bVar1 = isType<TypeTypeID>(node), bVar1)) ||
          ((bVar1 = isType<TypeFunctionID>(node), bVar1 ||
           ((bVar1 = isType<TypeNullptr>(node), bVar1 || (bVar1 = isType<TypeRef>(node), bVar1))))))
         )) {
        Print(ctx,"*(");
        Translate(ctx,expression->address);
        Print(ctx,") = 0");
      }
      else {
        bVar1 = isType<TypeFloat>(node);
        if (bVar1) {
          Print(ctx,"*(");
          Translate(ctx,expression->address);
          Print(ctx,") = 0.0f");
        }
        else {
          bVar1 = isType<TypeDouble>(node);
          if (bVar1) {
            Print(ctx,"*(");
            Translate(ctx,expression->address);
            Print(ctx,") = 0.0");
          }
          else {
            bVar1 = isType<TypeAutoRef>(node);
            if (((((!bVar1) && (bVar1 = isType<TypeAutoArray>(node), !bVar1)) &&
                 (bVar1 = isType<TypeArray>(node), !bVar1)) &&
                ((bVar1 = isType<TypeUnsizedArray>(node), !bVar1 &&
                 (bVar1 = isType<TypeFunction>(node), !bVar1)))) &&
               ((bVar1 = isType<TypeClass>(node), !bVar1 && (bVar1 = isType<TypeEnum>(node), !bVar1)
                ))) {
              __assert_fail("!\"unknown type\"",
                            "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTranslate.cpp"
                            ,0x4db,
                            "void TranslateZeroInitialize(ExpressionTranslateContext &, ExprZeroInitialize *)"
                           );
            }
            Print(ctx,"memset(");
            Translate(ctx,expression->address);
            Print(ctx,", 0, %d)",node->size & 0xffffffff);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void TranslateZeroInitialize(ExpressionTranslateContext &ctx, ExprZeroInitialize *expression)
{
	TypeRef *refType = getType<TypeRef>(expression->address->type);

	assert(refType);

	TypeBase *type = refType->subType;

	if(isType<TypeVoid>(type))
	{
		Print(ctx, "0");
	}
	else if(isType<TypeBool>(type))
	{
		Print(ctx, "*(");
		Translate(ctx, expression->address);
		Print(ctx, ") = false");
	}
	else if(isType<TypeChar>(type) || isType<TypeShort>(type) || isType<TypeInt>(type) || isType<TypeLong>(type) || isType<TypeTypeID>(type) || isType<TypeFunctionID>(type) || isType<TypeNullptr>(type) || isType<TypeRef>(type))
	{
		Print(ctx, "*(");
		Translate(ctx, expression->address);
		Print(ctx, ") = 0");
	}
	else if(isType<TypeFloat>(type))
	{
		Print(ctx, "*(");
		Translate(ctx, expression->address);
		Print(ctx, ") = 0.0f");
	}
	else if(isType<TypeDouble>(type))
	{
		Print(ctx, "*(");
		Translate(ctx, expression->address);
		Print(ctx, ") = 0.0");
	}
	else if(isType<TypeAutoRef>(type) || isType<TypeAutoArray>(type) || isType<TypeArray>(type) || isType<TypeUnsizedArray>(type) || isType<TypeFunction>(type) || isType<TypeClass>(type) || isType<TypeEnum>(type))
	{
		Print(ctx, "memset(");
		Translate(ctx, expression->address);
		Print(ctx, ", 0, %d)", unsigned(type->size));
	}
	else
	{
		assert(!"unknown type");
	}
}